

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ReconstructIntra4(VP8EncIterator *it,int16_t *levels,uint8_t *src,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  VP8Encoder *enc;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  int16_t tmp [16];
  int16_t local_58 [20];
  
  enc = it->enc;
  uVar1 = VP8I4ModeOffsets[mode];
  puVar2 = it->yuv_p;
  uVar4 = *(byte *)it->mb >> 5 & 3;
  (*VP8FTransform)(src,puVar2 + uVar1,local_58);
  if (it->do_trellis == 0) {
    iVar3 = (*VP8EncQuantizeBlock)(local_58,levels,&enc->dqm[uVar4].y1);
  }
  else {
    iVar3 = TrellisQuantizeBlock
                      (enc,local_58,levels,it->left_nz[it->i4 >> 2] + it->top_nz[it->i4 & 3],3,
                       &enc->dqm[uVar4].y1,enc->dqm[uVar4].lambda_trellis_i4);
  }
  (*VP8ITransform)(puVar2 + uVar1,local_58,yuv_out,0);
  return iVar3;
}

Assistant:

static int ReconstructIntra4(VP8EncIterator* WEBP_RESTRICT const it,
                             int16_t levels[16],
                             const uint8_t* WEBP_RESTRICT const src,
                             uint8_t* WEBP_RESTRICT const yuv_out,
                             int mode) {
  const VP8Encoder* const enc = it->enc;
  const uint8_t* const ref = it->yuv_p + VP8I4ModeOffsets[mode];
  const VP8SegmentInfo* const dqm = &enc->dqm[it->mb->segment];
  int nz = 0;
  int16_t tmp[16];

  VP8FTransform(src, ref, tmp);
  if (DO_TRELLIS_I4 && it->do_trellis) {
    const int x = it->i4 & 3, y = it->i4 >> 2;
    const int ctx = it->top_nz[x] + it->left_nz[y];
    nz = TrellisQuantizeBlock(enc, tmp, levels, ctx, TYPE_I4_AC, &dqm->y1,
                              dqm->lambda_trellis_i4);
  } else {
    nz = VP8EncQuantizeBlock(tmp, levels, &dqm->y1);
  }
  VP8ITransform(ref, tmp, yuv_out, 0);
  return nz;
}